

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3FkActions(Parse *pParse,Table *pTab,ExprList *pChanges,int regOld,int *aChange,
                     int bChngRowid)

{
  int iVar1;
  Trigger *pTVar2;
  undefined4 in_ECX;
  Table *in_RDX;
  Parse *in_RSI;
  long *in_RDI;
  int *in_R8;
  int in_R9D;
  Trigger *pAct;
  FKey *pFKey;
  ExprList *in_stack_00000140;
  FKey *in_stack_00000148;
  Table *in_stack_00000150;
  Parse *in_stack_00000158;
  FKey *local_38;
  undefined4 in_stack_ffffffffffffffe0;
  
  if ((*(uint *)(*in_RDI + 0x2c) & 0x80000) != 0) {
    for (local_38 = sqlite3FkReferences((Table *)0x1a12c4); local_38 != (FKey *)0x0;
        local_38 = local_38->pNextTo) {
      if (((in_R8 == (int *)0x0) ||
          (iVar1 = fkParentIsModified(in_RDX,(FKey *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                                      in_R8,in_R9D), iVar1 != 0)) &&
         (pTVar2 = fkActionTrigger(in_stack_00000158,in_stack_00000150,in_stack_00000148,
                                   in_stack_00000140), pTVar2 != (Trigger *)0x0)) {
        sqlite3CodeRowTriggerDirect
                  (in_RSI,(Trigger *)in_RDX,(Table *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                   (int)((ulong)in_R8 >> 0x20),(int)in_R8,in_R9D);
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkActions(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being updated or deleted from */
  ExprList *pChanges,             /* Change-list for UPDATE, NULL for DELETE */
  int regOld,                     /* Address of array containing old row */
  int *aChange,                   /* Array indicating UPDATEd columns (or 0) */
  int bChngRowid                  /* True if rowid is UPDATEd */
){
  /* If foreign-key support is enabled, iterate through all FKs that 
  ** refer to table pTab. If there is an action associated with the FK 
  ** for this operation (either update or delete), invoke the associated 
  ** trigger sub-program.  */
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    FKey *pFKey;                  /* Iterator variable */
    for(pFKey = sqlite3FkReferences(pTab); pFKey; pFKey=pFKey->pNextTo){
      if( aChange==0 || fkParentIsModified(pTab, pFKey, aChange, bChngRowid) ){
        Trigger *pAct = fkActionTrigger(pParse, pTab, pFKey, pChanges);
        if( pAct ){
          sqlite3CodeRowTriggerDirect(pParse, pAct, pTab, regOld, OE_Abort, 0);
        }
      }
    }
  }
}